

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O2

BigInt<unsigned_int,_unsigned_long> * __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::operator+=
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  long lVar5;
  uint in_EAX;
  pointer puVar6;
  uint *puVar7;
  ulong __new_size;
  ulong uVar8;
  ulong uVar9;
  pointer puVar10;
  uint *puVar11;
  long lVar12;
  undefined8 uStack_18;
  
  puVar10 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar6 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar10 == puVar6) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->_values,&x->_values);
    this->_positive = x->_positive;
  }
  else {
    puVar2 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      if (this->_positive == x->_positive) {
        __new_size = (long)puVar6 - (long)puVar10 >> 2;
        uVar9 = (long)puVar3 - (long)puVar2 >> 2;
        puVar6 = puVar2;
        uVar8 = uVar9;
        if (__new_size < uVar9) {
          puVar6 = puVar10;
          uVar8 = __new_size;
          puVar10 = puVar2;
          __new_size = uVar9;
        }
        lVar12 = __new_size * 4;
        do {
          if (uVar8 * 4 == lVar12) {
            uVar8 = 0xffffffff;
            goto LAB_00104fb5;
          }
          lVar5 = lVar12 + -4;
          lVar12 = lVar12 + -4;
        } while (*(int *)((long)puVar10 + lVar5) == -1);
LAB_00104fde:
        uStack_18 = (ulong)in_EAX;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&this->_values,__new_size,(value_type_conflict *)((long)&uStack_18 + 4));
        puVar4 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        puVar7 = (this->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = 0;
        for (puVar11 = (x->_values).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start; puVar11 != puVar4;
            puVar11 = puVar11 + 1) {
          uVar8 = uVar8 + *puVar11 + (ulong)*puVar7;
          *puVar7 = (uint)uVar8;
          uVar8 = uVar8 >> 0x20;
          puVar7 = puVar7 + 1;
        }
        while (uVar8 != 0) {
          uVar1 = *puVar7;
          *puVar7 = (uint)((ulong)uVar1 + 1);
          puVar7 = puVar7 + 1;
          uVar8 = (ulong)uVar1 + 1 >> 0x20;
        }
      }
      else {
        this->_positive = (bool)(this->_positive ^ 1);
        operator-=(this,x);
        this->_positive = (bool)(this->_positive ^ 1);
      }
    }
  }
  return this;
LAB_00104fb5:
  if ((lVar12 == 0) || (uVar8 != 0xffffffff)) goto LAB_00104fde;
  uVar8 = (ulong)*(uint *)((long)puVar10 + lVar12 + -4) +
          (ulong)*(uint *)((long)puVar6 + lVar12 + -4);
  if (uVar8 >> 0x20 != 0) {
    __new_size = __new_size + 1;
    goto LAB_00104fde;
  }
  lVar12 = lVar12 + -4;
  goto LAB_00104fb5;
}

Assistant:

constexpr BigInt<TBase, TBuffer>& BigInt<TBase, TBuffer>::operator+=(const BigInt<TBase, TBuffer>& x)
	{
		// If this == 0, return x

		if (_values.empty())
		{
			_values = x._values;
			_positive = x._positive;
			return *this;
		}

		// If x == 0, return this

		if (x._values.empty())
		{
			return *this;
		}

		// If this and x are not the same sign, perform a substraction

		if (_positive != x._positive)
		{
			_positive = !_positive;
			*this -= x;
			_positive = !_positive;
			return *this;
		}

		// Identifying the "biggest" number (the one with the most "digits")

		uint64_t sizeBig;
		uint64_t sizeSmall;
		const TBase* itBigBeg;
		const TBase* itSmallBeg;
		if (_values.size() >= x._values.size())
		{
			sizeBig = _values.size();
			sizeSmall = x._values.size();
			itBigBeg = _values.data();
			itSmallBeg = x._values.data();
		}
		else
		{
			sizeBig = x._values.size();
			sizeSmall = _values.size();
			itBigBeg = x._values.data();
			itSmallBeg = _values.data();
		}

		// Finding if an additional digit is necessary

		const TBase* itBig = itBigBeg + sizeBig - 1;
		const TBase* itSmall = itSmallBeg + sizeBig - 1;
		const TBase* itSmallEnd = itSmallBeg + sizeSmall - 1;
		while (itSmall != itSmallEnd && *itBig == _baseMax)
		{
			--itSmall;
			--itBig;
		}

		TBuffer buffer = _baseMax;
		uint64_t newSize = sizeBig;

		if (itSmall == itSmallEnd)
		{
			itSmallEnd = itSmallBeg - 1;
			while (itSmall != itSmallEnd && buffer == _baseMax)
			{
				buffer = static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itBig);
				if (buffer > _baseMax)
				{
					++newSize;
					break;
				}

				--itSmall;
				--itBig;
			}
		}

		// Compute the addition

		_values.resize(newSize, 0);
		itSmall = x._values.data();
		sizeSmall = x._values.size();

		itSmallEnd = itSmall + sizeSmall;

		TBase* itOut = _values.data();
		buffer = 0;
		while (itSmall != itSmallEnd)
		{
			buffer += static_cast<TBuffer>(*itSmall) + static_cast<TBuffer>(*itOut);
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itSmall;
			++itOut;
		}

		while (buffer != 0)
		{
			buffer += *itOut;
			*itOut = buffer & _bufferLowFilter;
			buffer >>= _baseBitSize;

			++itOut;
		}

		return *this;
	}